

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

void __thiscall
BmsParseDuplicateHeaderException::BmsParseDuplicateHeaderException
          (BmsParseDuplicateHeaderException *this,uint line,string *header)

{
  (this->super_BmsParseException).line_ = line;
  (this->super_BmsParseException).super_BmsException._vptr_BmsException =
       (_func_int **)&PTR_Message_abi_cxx11__00144518;
  std::__cxx11::string::string((string *)&this->header_,(string *)header);
  return;
}

Assistant:

BmsParseException::BmsParseException( unsigned int line ) :
line_( line )
{
}